

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

uint __thiscall embree::SubdivMesh::getFace(SubdivMesh *this,uint edgeID)

{
  undefined8 *puVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if ((ulong)edgeID < this->numHalfEdges) {
    return (this->halfEdgeFace).items[edgeID];
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid edge","");
  *puVar1 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_40,local_40 + local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

unsigned int SubdivMesh::getFace(unsigned int edgeID)
  {
    if (edgeID >= numHalfEdges)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid edge");

    return halfEdgeFace[edgeID];
  }